

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.cpp
# Opt level: O1

void duckdb::RepeatListFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  ulong *puVar1;
  VectorType VVar2;
  VectorType VVar3;
  unsigned_long *puVar4;
  idx_t *piVar5;
  data_ptr_t pdVar6;
  long *plVar7;
  data_ptr_t pdVar8;
  idx_t iVar9;
  sel_t *psVar10;
  sel_t *psVar11;
  data_ptr_t pdVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar13;
  element_type *peVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  reference vector;
  reference vector_00;
  Vector *source;
  Vector *target;
  idx_t iVar16;
  TemplatedValidityData<unsigned_long> *pTVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  unsigned_long uVar21;
  idx_t iVar22;
  idx_t iVar23;
  idx_t iVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  UnifiedVectorFormat ldata;
  idx_t local_168;
  ulong local_108;
  element_type *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  ulong local_d0;
  idx_t local_c8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  source = ListVector::GetEntry(vector);
  target = ListVector::GetEntry(result);
  iVar16 = ListVector::GetListSize(result);
  VVar2 = vector->vector_type;
  VVar3 = vector_00->vector_type;
  local_168 = iVar16;
  if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    piVar5 = (idx_t *)result->data;
    if (((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) &&
       ((puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar4 == (unsigned_long *)0x0 || ((*puVar4 & 1) != 0)))) {
      iVar9 = *(idx_t *)vector->data;
      iVar23 = *(idx_t *)((long)vector->data + 8);
      lVar30 = *(long *)vector_00->data;
      lVar29 = 0;
      if (iVar23 != 0 && 0 < lVar30) {
        lVar29 = lVar30;
      }
      ListVector::Reserve(result,iVar16 + lVar29 * iVar23);
      if (iVar23 != 0 && 0 < lVar30) {
        lVar30 = lVar29 + (ulong)(lVar29 == 0);
        do {
          VectorOperations::Copy(source,target,iVar23 + iVar9,iVar9,local_168);
          local_168 = local_168 + iVar23;
          lVar30 = lVar30 + -1;
        } while (lVar30 != 0);
      }
      *piVar5 = iVar16;
      piVar5[1] = lVar29 * iVar23;
      goto LAB_01b46303;
    }
  }
  else {
    iVar9 = args->count;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      pdVar6 = vector->data;
      plVar7 = (long *)vector_00->data;
      puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar8 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (iVar9 != 0) {
            lVar30 = *plVar7;
            iVar23 = 0;
            do {
              lVar26 = iVar23 * 0x10;
              lVar29 = *(long *)(pdVar6 + lVar26 + 8);
              lVar25 = 0;
              if (lVar29 != 0 && 0 < lVar30) {
                lVar25 = lVar30;
              }
              iVar24 = *(idx_t *)(pdVar6 + lVar26);
              ListVector::Reserve(result,lVar25 * lVar29 + iVar16);
              local_168 = iVar16;
              if (lVar29 != 0 && 0 < lVar30) {
                lVar28 = lVar25 + (ulong)(lVar25 == 0);
                do {
                  VectorOperations::Copy(source,target,lVar29 + iVar24,iVar24,local_168);
                  local_168 = local_168 + lVar29;
                  lVar28 = lVar28 + -1;
                } while (lVar28 != 0);
              }
              *(idx_t *)(pdVar8 + lVar26) = iVar16;
              *(long *)(pdVar8 + lVar26 + 8) = lVar25 * lVar29;
              iVar23 = iVar23 + 1;
              iVar16 = local_168;
            } while (iVar23 != iVar9);
          }
        }
        else if (0x3f < iVar9 + 0x3f) {
          local_108 = 0;
          uVar18 = 0;
          do {
            puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar4 == (unsigned_long *)0x0) {
              uVar21 = 0xffffffffffffffff;
            }
            else {
              uVar21 = puVar4[local_108];
            }
            uVar20 = uVar18 + 0x40;
            if (iVar9 <= uVar18 + 0x40) {
              uVar20 = iVar9;
            }
            uVar19 = uVar20;
            if (uVar21 != 0) {
              uVar19 = uVar18;
              if (uVar21 == 0xffffffffffffffff) {
                if (uVar18 < uVar20) {
                  lVar30 = *plVar7;
                  iVar16 = local_168;
                  do {
                    lVar26 = uVar18 * 0x10;
                    lVar29 = *(long *)(pdVar6 + lVar26 + 8);
                    lVar25 = 0;
                    if (lVar29 != 0 && 0 < lVar30) {
                      lVar25 = lVar30;
                    }
                    iVar23 = *(idx_t *)(pdVar6 + lVar26);
                    ListVector::Reserve(result,lVar25 * lVar29 + iVar16);
                    local_168 = iVar16;
                    if (lVar29 != 0 && 0 < lVar30) {
                      lVar28 = lVar25 + (ulong)(lVar25 == 0);
                      do {
                        VectorOperations::Copy(source,target,lVar29 + iVar23,iVar23,local_168);
                        local_168 = local_168 + lVar29;
                        lVar28 = lVar28 + -1;
                      } while (lVar28 != 0);
                    }
                    *(idx_t *)(pdVar8 + lVar26) = iVar16;
                    *(long *)(pdVar8 + lVar26 + 8) = lVar25 * lVar29;
                    uVar18 = uVar18 + 1;
                    uVar19 = uVar18;
                    iVar16 = local_168;
                  } while (uVar18 != uVar20);
                }
              }
              else if (uVar18 < uVar20) {
                do {
                  if ((uVar21 >> ((ulong)(uint)((int)uVar19 - (int)uVar18) & 0x3f) & 1) != 0) {
                    lVar26 = uVar19 * 0x10;
                    lVar30 = *(long *)(pdVar6 + lVar26 + 8);
                    lVar29 = *plVar7;
                    lVar25 = 0;
                    if (lVar30 != 0 && 0 < lVar29) {
                      lVar25 = lVar29;
                    }
                    iVar16 = *(idx_t *)(pdVar6 + lVar26);
                    ListVector::Reserve(result,lVar25 * lVar30 + local_168);
                    iVar23 = local_168;
                    if (lVar30 != 0 && 0 < lVar29) {
                      lVar29 = lVar25 + (ulong)(lVar25 == 0);
                      do {
                        VectorOperations::Copy(source,target,lVar30 + iVar16,iVar16,iVar23);
                        iVar23 = iVar23 + lVar30;
                        lVar29 = lVar29 + -1;
                      } while (lVar29 != 0);
                    }
                    *(idx_t *)(pdVar8 + lVar26) = local_168;
                    *(long *)(pdVar8 + lVar26 + 8) = lVar25 * lVar30;
                    local_168 = iVar23;
                  }
                  uVar19 = uVar19 + 1;
                } while (uVar19 != uVar20);
              }
            }
            local_108 = local_108 + 1;
            uVar18 = uVar19;
          } while (local_108 != iVar9 + 0x3f >> 6);
        }
        goto LAB_01b46303;
      }
    }
    else {
      if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
          pdVar6 = vector->data;
          pdVar8 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar12 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,iVar9);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (iVar9 != 0) {
              iVar23 = 0;
              do {
                lVar26 = iVar23 * 0x10;
                lVar30 = *(long *)(pdVar6 + lVar26 + 8);
                lVar29 = *(long *)(pdVar8 + iVar23 * 8);
                lVar25 = 0;
                if (lVar30 != 0 && 0 < lVar29) {
                  lVar25 = lVar29;
                }
                iVar24 = *(idx_t *)(pdVar6 + lVar26);
                ListVector::Reserve(result,iVar16 + lVar25 * lVar30);
                local_168 = iVar16;
                if (lVar30 != 0 && 0 < lVar29) {
                  lVar29 = lVar25 + (ulong)(lVar25 == 0);
                  do {
                    VectorOperations::Copy(source,target,lVar30 + iVar24,iVar24,local_168);
                    local_168 = local_168 + lVar30;
                    lVar29 = lVar29 + -1;
                  } while (lVar29 != 0);
                }
                *(idx_t *)(pdVar12 + lVar26) = iVar16;
                *(long *)(pdVar12 + lVar26 + 8) = lVar25 * lVar30;
                iVar23 = iVar23 + 1;
                iVar16 = local_168;
              } while (iVar23 != iVar9);
            }
          }
          else if (0x3f < iVar9 + 0x3f) {
            local_d0 = iVar9 + 0x3f >> 6;
            local_108 = 0;
            uVar18 = 0;
            do {
              puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar4 == (unsigned_long *)0x0) {
                uVar21 = 0xffffffffffffffff;
              }
              else {
                uVar21 = puVar4[local_108];
              }
              uVar20 = uVar18 + 0x40;
              if (iVar9 <= uVar18 + 0x40) {
                uVar20 = iVar9;
              }
              uVar19 = uVar20;
              if (uVar21 != 0) {
                uVar19 = uVar18;
                if (uVar21 == 0xffffffffffffffff) {
                  iVar23 = iVar16;
                  if (uVar18 < uVar20) {
                    do {
                      lVar26 = uVar18 * 0x10;
                      lVar30 = *(long *)(pdVar6 + lVar26 + 8);
                      lVar29 = *(long *)(pdVar8 + uVar18 * 8);
                      lVar25 = 0;
                      if (lVar30 != 0 && 0 < lVar29) {
                        lVar25 = lVar29;
                      }
                      iVar24 = *(idx_t *)(pdVar6 + lVar26);
                      ListVector::Reserve(result,lVar25 * lVar30 + iVar23);
                      iVar16 = iVar23;
                      if (lVar30 != 0 && 0 < lVar29) {
                        lVar29 = lVar25 + (ulong)(lVar25 == 0);
                        do {
                          VectorOperations::Copy(source,target,lVar30 + iVar24,iVar24,iVar16);
                          iVar16 = iVar16 + lVar30;
                          lVar29 = lVar29 + -1;
                        } while (lVar29 != 0);
                      }
                      *(idx_t *)(pdVar12 + lVar26) = iVar23;
                      *(long *)(pdVar12 + lVar26 + 8) = lVar25 * lVar30;
                      uVar18 = uVar18 + 1;
                      uVar19 = uVar18;
                      iVar23 = iVar16;
                    } while (uVar18 != uVar20);
                  }
                }
                else {
                  iVar23 = iVar16;
                  if (uVar18 < uVar20) {
                    do {
                      iVar16 = iVar23;
                      if ((uVar21 >> ((ulong)(uint)((int)uVar19 - (int)uVar18) & 0x3f) & 1) != 0) {
                        lVar26 = uVar19 * 0x10;
                        lVar30 = *(long *)(pdVar6 + lVar26 + 8);
                        lVar29 = *(long *)(pdVar8 + uVar19 * 8);
                        lVar25 = 0;
                        if (lVar30 != 0 && 0 < lVar29) {
                          lVar25 = lVar29;
                        }
                        iVar24 = *(idx_t *)(pdVar6 + lVar26);
                        ListVector::Reserve(result,lVar25 * lVar30 + iVar23);
                        if (lVar30 != 0 && 0 < lVar29) {
                          lVar29 = lVar25 + (ulong)(lVar25 == 0);
                          do {
                            VectorOperations::Copy(source,target,lVar30 + iVar24,iVar24,iVar16);
                            iVar16 = iVar16 + lVar30;
                            lVar29 = lVar29 + -1;
                          } while (lVar29 != 0);
                        }
                        *(idx_t *)(pdVar12 + lVar26) = iVar23;
                        *(long *)(pdVar12 + lVar26 + 8) = lVar25 * lVar30;
                      }
                      uVar19 = uVar19 + 1;
                      iVar23 = iVar16;
                    } while (uVar19 != uVar20);
                  }
                }
              }
              local_108 = local_108 + 1;
              uVar18 = uVar19;
              local_168 = iVar16;
            } while (local_108 != local_d0);
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          Vector::ToUnifiedFormat(vector,iVar9,&local_78);
          Vector::ToUnifiedFormat(vector_00,iVar9,&local_c0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar6 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (iVar9 != 0) {
              psVar10 = (local_78.sel)->sel_vector;
              psVar11 = (local_c0.sel)->sel_vector;
              iVar23 = 0;
              do {
                iVar16 = iVar23;
                if (psVar10 != (sel_t *)0x0) {
                  iVar16 = (idx_t)psVar10[iVar23];
                }
                iVar24 = iVar23;
                if (psVar11 != (sel_t *)0x0) {
                  iVar24 = (idx_t)psVar11[iVar23];
                }
                lVar30 = *(long *)(local_78.data + iVar16 * 0x10 + 8);
                lVar29 = *(long *)(local_c0.data + iVar24 * 8);
                lVar25 = 0;
                if (lVar30 != 0 && 0 < lVar29) {
                  lVar25 = lVar29;
                }
                iVar24 = *(idx_t *)(local_78.data + iVar16 * 0x10);
                ListVector::Reserve(result,lVar25 * lVar30 + local_168);
                iVar16 = local_168;
                if (lVar30 != 0 && 0 < lVar29) {
                  lVar29 = lVar25 + (ulong)(lVar25 == 0);
                  do {
                    VectorOperations::Copy(source,target,lVar30 + iVar24,iVar24,iVar16);
                    iVar16 = iVar16 + lVar30;
                    lVar29 = lVar29 + -1;
                  } while (lVar29 != 0);
                }
                *(idx_t *)(pdVar6 + iVar23 * 0x10) = local_168;
                *(long *)(pdVar6 + iVar23 * 0x10 + 8) = lVar25 * lVar30;
                iVar23 = iVar23 + 1;
                local_168 = iVar16;
              } while (iVar23 != iVar9);
            }
          }
          else if (iVar9 != 0) {
            psVar10 = (local_78.sel)->sel_vector;
            psVar11 = (local_c0.sel)->sel_vector;
            uVar18 = 0;
            do {
              uVar20 = uVar18;
              if (psVar10 != (sel_t *)0x0) {
                uVar20 = (ulong)psVar10[uVar18];
              }
              uVar19 = uVar18;
              if (psVar11 != (sel_t *)0x0) {
                uVar19 = (ulong)psVar11[uVar18];
              }
              if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar20 >> 6] >> (uVar20 & 0x3f) & 1) != 0)) &&
                 ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0)))) {
                lVar30 = *(long *)(local_78.data + uVar20 * 0x10 + 8);
                lVar29 = *(long *)(local_c0.data + uVar19 * 8);
                lVar25 = 0;
                if (lVar30 != 0 && 0 < lVar29) {
                  lVar25 = lVar29;
                }
                iVar23 = *(idx_t *)(local_78.data + uVar20 * 0x10);
                ListVector::Reserve(result,lVar25 * lVar30 + iVar16);
                iVar24 = iVar16;
                if (lVar30 != 0 && 0 < lVar29) {
                  lVar29 = lVar25 + (ulong)(lVar25 == 0);
                  do {
                    VectorOperations::Copy(source,target,lVar30 + iVar23,iVar23,iVar24);
                    iVar24 = iVar24 + lVar30;
                    lVar29 = lVar29 + -1;
                  } while (lVar29 != 0);
                }
                *(idx_t *)(pdVar6 + uVar18 * 0x10) = iVar16;
                *(long *)(pdVar6 + uVar18 * 0x10 + 8) = lVar25 * lVar30;
                iVar16 = iVar24;
              }
              else {
                if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_c8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_e8,&local_c8);
                  p_Var15 = p_Stack_e0;
                  peVar14 = local_e8;
                  local_e8 = (element_type *)0x0;
                  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar14;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var15;
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  }
                  if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
                  }
                  pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar17->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar13 = (byte)uVar18 & 0x3f;
                puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                         + (uVar18 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != iVar9);
          }
          if (local_c0.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          local_168 = iVar16;
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        goto LAB_01b46303;
      }
      piVar5 = (idx_t *)vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar6 = vector_00->data;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar8 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (iVar9 != 0) {
            iVar23 = *piVar5;
            iVar24 = piVar5[1];
            iVar22 = 0;
            do {
              lVar30 = *(long *)(pdVar6 + iVar22 * 8);
              lVar29 = 0;
              if (0 < lVar30 && iVar24 != 0) {
                lVar29 = lVar30;
              }
              ListVector::Reserve(result,iVar16 + lVar29 * iVar24);
              local_168 = iVar16;
              if (0 < lVar30 && iVar24 != 0) {
                lVar30 = lVar29 + (ulong)(lVar29 == 0);
                do {
                  VectorOperations::Copy(source,target,iVar23 + iVar24,iVar23,local_168);
                  local_168 = local_168 + iVar24;
                  lVar30 = lVar30 + -1;
                } while (lVar30 != 0);
              }
              *(idx_t *)(pdVar8 + iVar22 * 0x10) = iVar16;
              *(idx_t *)(pdVar8 + iVar22 * 0x10 + 8) = lVar29 * iVar24;
              iVar22 = iVar22 + 1;
              iVar16 = local_168;
            } while (iVar22 != iVar9);
          }
        }
        else if (0x3f < iVar9 + 0x3f) {
          uVar20 = 0;
          uVar18 = 0;
          do {
            puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar4 == (unsigned_long *)0x0) {
              uVar21 = 0xffffffffffffffff;
            }
            else {
              uVar21 = puVar4[uVar20];
            }
            uVar19 = uVar18 + 0x40;
            if (iVar9 <= uVar18 + 0x40) {
              uVar19 = iVar9;
            }
            uVar27 = uVar19;
            if (uVar21 != 0) {
              uVar27 = uVar18;
              if (uVar21 == 0xffffffffffffffff) {
                if (uVar18 < uVar19) {
                  iVar16 = *piVar5;
                  iVar23 = piVar5[1];
                  iVar24 = local_168;
                  do {
                    lVar30 = *(long *)(pdVar6 + uVar18 * 8);
                    lVar29 = 0;
                    if (0 < lVar30 && iVar23 != 0) {
                      lVar29 = lVar30;
                    }
                    ListVector::Reserve(result,lVar29 * iVar23 + iVar24);
                    local_168 = iVar24;
                    if (0 < lVar30 && iVar23 != 0) {
                      lVar30 = lVar29 + (ulong)(lVar29 == 0);
                      do {
                        VectorOperations::Copy(source,target,iVar23 + iVar16,iVar16,local_168);
                        local_168 = local_168 + iVar23;
                        lVar30 = lVar30 + -1;
                      } while (lVar30 != 0);
                    }
                    *(idx_t *)(pdVar8 + uVar18 * 0x10) = iVar24;
                    *(idx_t *)(pdVar8 + uVar18 * 0x10 + 8) = lVar29 * iVar23;
                    uVar18 = uVar18 + 1;
                    uVar27 = uVar18;
                    iVar24 = local_168;
                  } while (uVar18 != uVar19);
                }
              }
              else if (uVar18 < uVar19) {
                do {
                  if ((uVar21 >> ((ulong)(uint)((int)uVar27 - (int)uVar18) & 0x3f) & 1) != 0) {
                    iVar16 = piVar5[1];
                    lVar30 = *(long *)(pdVar6 + uVar27 * 8);
                    lVar29 = 0;
                    if (iVar16 != 0 && 0 < lVar30) {
                      lVar29 = lVar30;
                    }
                    iVar23 = *piVar5;
                    ListVector::Reserve(result,lVar29 * iVar16 + local_168);
                    iVar24 = local_168;
                    if (iVar16 != 0 && 0 < lVar30) {
                      lVar30 = lVar29 + (ulong)(lVar29 == 0);
                      do {
                        VectorOperations::Copy(source,target,iVar16 + iVar23,iVar23,iVar24);
                        iVar24 = iVar24 + iVar16;
                        lVar30 = lVar30 + -1;
                      } while (lVar30 != 0);
                    }
                    *(idx_t *)(pdVar8 + uVar27 * 0x10) = local_168;
                    *(idx_t *)(pdVar8 + uVar27 * 0x10 + 8) = lVar29 * iVar16;
                    local_168 = iVar24;
                  }
                  uVar27 = uVar27 + 1;
                } while (uVar27 != uVar19);
              }
            }
            uVar20 = uVar20 + 1;
            uVar18 = uVar27;
          } while (uVar20 != iVar9 + 0x3f >> 6);
        }
        goto LAB_01b46303;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
LAB_01b46303:
  ListVector::SetListSize(result,local_168);
  return;
}

Assistant:

static void RepeatListFunction(DataChunk &args, ExpressionState &, Vector &result) {
	auto &list_vector = args.data[0];
	auto &cnt_vector = args.data[1];

	auto &source_child = ListVector::GetEntry(list_vector);
	auto &result_child = ListVector::GetEntry(result);

	idx_t current_size = ListVector::GetListSize(result);
	BinaryExecutor::Execute<list_entry_t, int64_t, list_entry_t>(
	    list_vector, cnt_vector, result, args.size(), [&](list_entry_t list_input, int64_t cnt) {
		    idx_t copy_count = cnt <= 0 || list_input.length == 0 ? 0 : UnsafeNumericCast<idx_t>(cnt);
		    idx_t result_length = list_input.length * copy_count;
		    idx_t new_size = current_size + result_length;
		    ListVector::Reserve(result, new_size);
		    list_entry_t result_list;
		    result_list.offset = current_size;
		    result_list.length = result_length;
		    for (idx_t i = 0; i < copy_count; i++) {
			    // repeat the list contents "cnt" times
			    VectorOperations::Copy(source_child, result_child, list_input.offset + list_input.length,
			                           list_input.offset, current_size);
			    current_size += list_input.length;
		    }
		    return result_list;
	    });
	ListVector::SetListSize(result, current_size);
}